

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotExec.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  _Bool _Var2;
  GameMode GVar3;
  int extraout_EAX;
  UnitNode *pUVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  Map *map;
  long lVar9;
  bool bVar10;
  byte bVar11;
  undefined8 auStack_7868 [189];
  int local_727c;
  UnitList local_7278;
  _Bool progress [10];
  Path path;
  Windows windows;
  UnitList guards;
  undefined8 local_7208 [187];
  MapList mapList;
  Dialog dialog [10];
  
  bVar11 = 0;
  parseMap(argv[1],&mapList,dialog);
  uiInit(&windows);
  GVar3 = menuMain(&windows);
  if (GVar3 != EXIT) {
    local_727c = 0;
    do {
      if (GVar3 != NEW) {
        local_727c = levelSelect(&windows,&mapList,progress);
      }
      iVar1 = local_727c;
      lVar9 = (long)local_727c;
      map = mapList.level + lVar9;
      memcpy(local_7208,dialog + lVar9,0x5dc);
      puVar7 = local_7208;
      puVar8 = auStack_7868;
      for (lVar6 = 0x5dc; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined1 *)puVar8 = *(undefined1 *)puVar7;
        puVar7 = (undefined8 *)((long)puVar7 + (ulong)bVar11 * -2 + 1);
        puVar8 = (undefined8 *)((long)puVar8 + (ulong)bVar11 * -2 + 1);
      }
      drawText(&windows,GVar3);
      memcpy(local_7208,map,0x4f0);
      puVar7 = local_7208;
      puVar8 = auStack_7868;
      for (lVar6 = 0x9e; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      }
      getGuards(&guards);
      memcpy(local_7208,map,0x4f0);
      puVar7 = local_7208;
      puVar8 = auStack_7868;
      for (lVar6 = 0x9e; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      }
      getPath(&path);
      local_7278.head = (UnitNode *)0x0;
      local_7278.tail = (UnitNode *)0x0;
      local_7278.count = 0;
      drawLevel(&windows,map,&guards);
      drawInmateSelection(&windows,map,&local_7278,&guards);
      pUVar4 = getHead(&local_7278);
      iVar5 = local_7278.count;
      if (local_7278.count < 1) {
        iVar5 = 0;
      }
      while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
        *(float *)((long)pUVar4->unit + 4) = (float)(path.first)->location;
        pUVar4 = pUVar4->next;
      }
      _Var2 = simulate(&windows,&guards,&local_7278,&path);
      progress[lVar9] = _Var2;
      memcpy(local_7208,dialog + lVar9,0x5dc);
      puVar7 = local_7208;
      puVar8 = auStack_7868;
      for (lVar6 = 0x5dc; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined1 *)puVar8 = *(undefined1 *)puVar7;
        puVar7 = (undefined8 *)((long)puVar7 + (ulong)bVar11 * -2 + 1);
        puVar8 = (undefined8 *)((long)puVar8 + (ulong)bVar11 * -2 + 1);
      }
      drawText(&windows,_Var2 ^ 0x65);
      if (iVar1 == 0x65) break;
      GVar3 = WIN;
    } while (_Var2);
  }
  uiFree(&windows);
  quit("Thanks for playing.\n");
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv) {
    enum GameMode gameMode;
    struct Windows windows;
    struct MapList mapList;
    struct Map *map;
    struct Dialog dialog[MAX_LEVELS];
    struct UnitList inmates, guards;
    struct UnitNode *unitNode;
    struct Path path;
    bool progress[MAX_LEVELS];
    int level=0;

    /* Parse map files */
    parseMap(argv[1], &mapList, dialog);

    /* Create nCurses WINDOWs */
    uiInit(&windows);

    /* Present user with main menu */
    gameMode = menuMain(&windows);

    do{
        if(gameMode==EXIT){
            break;
        } else if (gameMode!=NEW){
            level = levelSelect(&windows, &mapList, progress);
        }

        /* Select current map */
        map = &(mapList).level[level];

        /* Display intro text */
        drawText(&windows, dialog[level], gameMode);

        /* Initialize game elements */
        getGuards(&guards, *map);
        getPath(&path, *map);
        inmates.count = 0;
        inmates.head = NULL;
        inmates.tail = NULL;

        /* Draw level */
        drawLevel(&windows, map, &guards);

        /* Prompt user for unit selection */
        drawInmateSelection(&windows, map, &inmates, &guards);

        unitNode = getHead(&inmates);
        for (int i = 0; i < inmates.count; i++) {
            ((struct Inmate *) unitNode->unit)->position = path.first->location;
            unitNode = unitNode->next;
        }

        /* Simulate unit interactions */
        progress[level] = simulate(&windows, &guards, &inmates, &path);
        if(progress[level]) gameMode=WIN;
        else gameMode=LOSE;

        /* Display outro text */
        drawText(&windows, dialog[level], gameMode);

    } while (level!=EXIT);

    uiFree(&windows);
    quit("Thanks for playing.\n");

    return 0;
}